

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::CullingTest::iterate(CullingTest *this)

{
  Vec4 *pVVar1;
  uint uVar2;
  GLenum GVar3;
  pointer pVVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  char *pcVar8;
  size_t sVar9;
  Vec4 *pVVar10;
  long lVar11;
  Vec4 *pVVar12;
  CullingTest *pCVar13;
  _func_int ***v1;
  Vec4 *v0;
  long lVar14;
  _func_int ***v0_00;
  long lVar15;
  float fVar16;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  triangles;
  Surface resultImage;
  Random rnd;
  RasterizationArguments args;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_228;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_208;
  uint local_1ec;
  CullingTest *local_1e8;
  Surface local_1e0;
  undefined1 local_1c8 [8];
  pointer pSStack_1c0;
  pointer local_1b8;
  TestContext *pTStack_1b0;
  _func_int **local_1a8;
  TestContext *pTStack_1a0;
  float local_198 [12];
  bool local_168;
  bool local_167;
  bool local_166;
  ios_base local_150 [268];
  RasterizationArguments local_44;
  
  iVar7 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&local_1e0,iVar7,iVar7);
  local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deRandom_init((deRandom *)local_1c8,0x849ea);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(&local_228,6);
  if (0 < (int)((ulong)((long)local_228.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_228.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    lVar11 = 0;
    lVar14 = 0;
    do {
      fVar16 = deRandom_getFloat((deRandom *)local_1c8);
      *(float *)((long)&(((BaseRenderingCase *)
                         (local_228.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestCase).
                        super_TestCase.super_TestNode._vptr_TestNode + lVar11) = fVar16 * 1.8 + -0.9
      ;
      fVar16 = deRandom_getFloat((deRandom *)local_1c8);
      *(float *)((long)&(((BaseRenderingCase *)
                         (local_228.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestCase).
                        super_TestCase.super_TestNode._vptr_TestNode + lVar11 + 4) =
           fVar16 * 1.8 + -0.9;
      *(undefined8 *)
       ((long)&(((BaseRenderingCase *)
                (local_228.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestCase).super_TestCase.
               super_TestNode.m_testCtx + lVar11) = 0x3f80000000000000;
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar14 < (int)((ulong)((long)local_228.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_228.
                                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4));
  }
  uVar2 = *(uint *)&(this->super_BaseRenderingCase).field_0xc4;
  pVVar10 = (Vec4 *)(ulong)uVar2;
  local_1e8 = this;
  if (uVar2 != 0x408) {
    bVar6 = (uVar2 == 0x404) != (this->m_faceOrder == 0x901);
    GVar3 = this->m_primitive;
    if (GVar3 == 4) {
      if (0 < (int)((ulong)((long)local_228.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_228.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2) {
        iVar7 = 0;
        do {
          pCVar13 = (CullingTest *)
                    (&(((BaseRenderingCase *)
                       (local_228.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestCase).
                      super_TestCase.super_TestNode._vptr_TestNode + (long)iVar7 * 2);
          v0_00 = &(((BaseRenderingCase *)
                    (local_228.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestCase).
                   super_TestCase.super_TestNode._vptr_TestNode + (long)(iVar7 + 1) * 2;
          v1 = &(((BaseRenderingCase *)
                 (local_228.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestCase).
                super_TestCase.super_TestNode._vptr_TestNode + (long)(int)(iVar7 + 2U) * 2;
          bVar5 = triangleOrder(pCVar13,(Vec4 *)v0_00,(Vec4 *)v1,(Vec4 *)(ulong)(iVar7 + 2U));
          if (bVar6 != bVar5) {
            local_198[8] = 0.0;
            local_198[9] = 0.0;
            local_198[10] = 0.0;
            local_198[0xb] = 0.0;
            local_198[4] = 0.0;
            local_198[5] = 0.0;
            local_198[6] = 0.0;
            local_198[7] = 0.0;
            local_198[0] = 0.0;
            local_198[1] = 0.0;
            local_198[2] = 0.0;
            local_198[3] = 0.0;
            local_1c8 = (undefined1  [8])
                        (pCVar13->super_BaseRenderingCase).super_TestCase.super_TestCase.
                        super_TestNode._vptr_TestNode;
            pSStack_1c0 = (pointer)(pCVar13->super_BaseRenderingCase).super_TestCase.super_TestCase.
                                   super_TestNode.m_testCtx;
            local_168 = false;
            local_1b8 = (pointer)*v0_00;
            pTStack_1b0 = (TestContext *)v0_00[1];
            local_167 = false;
            local_1a8 = *v1;
            pTStack_1a0 = (TestContext *)v1[1];
            local_166 = false;
            std::
            vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            ::push_back(&local_208,(value_type *)local_1c8);
          }
          iVar7 = iVar7 + 3;
        } while (iVar7 < (int)((ulong)((long)local_228.
                                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_228.
                                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2);
      }
    }
    else if (GVar3 == 5) {
      if (0 < (int)((ulong)((long)local_228.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_228.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2) {
        pVVar10 = (Vec4 *)(ulong)bVar6;
        local_1ec = (uint)bVar6;
        lVar15 = 0x200000000;
        lVar14 = 0x10;
        lVar11 = 0;
        do {
          pVVar4 = local_228.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pVVar1 = (Vec4 *)((long)&(((BaseRenderingCase *)
                                    (local_228.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_data)->
                                   super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                           lVar14);
          pCVar13 = (CullingTest *)
                    ((long)local_228.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar14 + -0x10);
          pVVar12 = (Vec4 *)((long)&(((BaseRenderingCase *)
                                     (local_228.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_data)->
                                    super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                            (lVar15 >> 0x1c));
          bVar6 = triangleOrder(pCVar13,pVVar1,pVVar12,pVVar10);
          if (((uint)lVar11 & 1 ^ local_1ec) != (uint)bVar6) {
            local_198[8] = 0.0;
            local_198[9] = 0.0;
            local_198[10] = 0.0;
            local_198[0xb] = 0.0;
            local_198[4] = 0.0;
            local_198[5] = 0.0;
            local_198[6] = 0.0;
            local_198[7] = 0.0;
            local_198[0] = 0.0;
            local_198[1] = 0.0;
            local_198[2] = 0.0;
            local_198[3] = 0.0;
            local_1c8 = (undefined1  [8])
                        (pCVar13->super_BaseRenderingCase).super_TestCase.super_TestCase.
                        super_TestNode._vptr_TestNode;
            pSStack_1c0 = *(pointer *)((long)pVVar4 + lVar14 + -8);
            local_168 = false;
            local_1b8 = *(pointer *)pVVar1->m_data;
            pTStack_1b0 = *(TestContext **)(pVVar1->m_data + 2);
            local_167 = false;
            local_1a8 = *(_func_int ***)pVVar12->m_data;
            pTStack_1a0 = *(TestContext **)(pVVar12->m_data + 2);
            local_166 = false;
            std::
            vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            ::push_back(&local_208,(value_type *)local_1c8);
          }
          lVar11 = lVar11 + 1;
          pVVar10 = (Vec4 *)(((long)local_228.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_228.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 +
                             -0x200000000 >> 0x20);
          lVar15 = lVar15 + 0x100000000;
          lVar14 = lVar14 + 0x10;
        } while (lVar11 < (long)pVVar10);
      }
    }
    else if ((GVar3 == 6) &&
            (1 < (int)((ulong)((long)local_228.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_228.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1)) {
      lVar14 = 1;
      lVar11 = 0x20;
      do {
        pVVar4 = local_228.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar1 = (Vec4 *)((long)&(((BaseRenderingCase *)
                                  (local_228.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_data)->
                                 super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                         lVar11);
        pVVar12 = (Vec4 *)((long)local_228.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x10);
        bVar5 = triangleOrder((CullingTest *)
                              local_228.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,pVVar12,pVVar1,pVVar10);
        if (bVar6 != bVar5) {
          local_198[8] = 0.0;
          local_198[9] = 0.0;
          local_198[10] = 0.0;
          local_198[0xb] = 0.0;
          local_198[4] = 0.0;
          local_198[5] = 0.0;
          local_198[6] = 0.0;
          local_198[7] = 0.0;
          local_198[0] = 0.0;
          local_198[1] = 0.0;
          local_198[2] = 0.0;
          local_198[3] = 0.0;
          local_1c8 = (undefined1  [8])
                      (((BaseRenderingCase *)pVVar4->m_data)->super_TestCase).super_TestCase.
                      super_TestNode._vptr_TestNode;
          pSStack_1c0 = (pointer)(((BaseRenderingCase *)pVVar4->m_data)->super_TestCase).
                                 super_TestCase.super_TestNode.m_testCtx;
          local_168 = false;
          local_1b8 = *(pointer *)pVVar12->m_data;
          pTStack_1b0 = *(TestContext **)((long)pVVar4 + lVar11 + -8);
          local_167 = false;
          local_1a8 = *(_func_int ***)pVVar1->m_data;
          pTStack_1a0 = *(TestContext **)(pVVar1->m_data + 2);
          local_166 = false;
          std::
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          ::push_back(&local_208,(value_type *)local_1c8);
        }
        lVar14 = lVar14 + 1;
        pVVar10 = (Vec4 *)0xffffffff00000000;
        lVar11 = lVar11 + 0x10;
      } while (lVar14 < ((long)local_228.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_228.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x100000000
                        >> 0x20);
    }
  }
  pCVar13 = local_1e8;
  iVar7 = (*((local_1e8->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar7);
  (**(code **)(lVar11 + 0x5e0))(0xb44);
  (**(code **)(lVar11 + 0x418))(*(undefined4 *)&(pCVar13->super_BaseRenderingCase).field_0xc4);
  (**(code **)(lVar11 + 0x6c0))(pCVar13->m_faceOrder);
  local_1c8 = (undefined1  [8])
              ((pCVar13->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_1c0,"Setting front face to ",0x16);
  pcVar8 = glu::getWindingName(pCVar13->m_faceOrder);
  iVar7 = (int)(ostringstream *)&pSStack_1c0;
  if (pcVar8 == (char *)0x0) {
    std::ios::clear(iVar7 + (int)*(undefined8 *)(pSStack_1c0[-1].colors[1].m_data + 3));
  }
  else {
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1c0,pcVar8,sVar9);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1c0);
  std::ios_base::~ios_base(local_150);
  local_1c8 = (undefined1  [8])
              ((pCVar13->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_1c0,"Setting cull face to ",0x15);
  pcVar8 = glu::getFaceName(*(int *)&(pCVar13->super_BaseRenderingCase).field_0xc4);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear(iVar7 + (int)*(undefined8 *)(pSStack_1c0[-1].colors[1].m_data + 3));
  }
  else {
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1c0,pcVar8,sVar9);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1c0);
  std::ios_base::~ios_base(local_150);
  local_1c8 = (undefined1  [8])
              ((pCVar13->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_1c0,"Drawing test pattern (",0x16);
  pcVar8 = glu::getPrimitiveTypeName(pCVar13->m_primitive);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear(iVar7 + (int)*(undefined8 *)(pSStack_1c0[-1].colors[1].m_data + 3));
  }
  else {
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1c0,pcVar8,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1c0,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1c0);
  std::ios_base::~ios_base(local_150);
  BaseRenderingCase::drawPrimitives
            (&pCVar13->super_BaseRenderingCase,&local_1e0,&local_228,pCVar13->m_primitive);
  local_44.numSamples = (pCVar13->super_BaseRenderingCase).m_numSamples;
  local_44.subpixelBits = (pCVar13->super_BaseRenderingCase).m_subpixelBits;
  local_44.redBits = (pCVar13->super_BaseRenderingCase).m_pixelFormat.redBits;
  local_44.greenBits = (pCVar13->super_BaseRenderingCase).m_pixelFormat.greenBits;
  local_44.blueBits = (pCVar13->super_BaseRenderingCase).m_pixelFormat.blueBits;
  local_1c8 = (undefined1  [8])
              local_208.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pSStack_1c0 = local_208.
                super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_1b8 = local_208.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar6 = tcu::verifyTriangleGroupRasterization
                    (&local_1e0,(TriangleSceneSpec *)local_1c8,&local_44,
                     ((pCVar13->super_BaseRenderingCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log,VERIFICATIONMODE_WEAK);
  pcVar8 = "Incorrect rendering";
  if (bVar6) {
    pcVar8 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((pCVar13->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)!bVar6,pcVar8);
  if (local_1c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1c8,(long)local_1b8 - (long)local_1c8);
  }
  if (local_208.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((CullingTest *)
      local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (CullingTest *)0x0) {
    operator_delete(local_228.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_1e0);
  return STOP;
}

Assistant:

CullingTest::IterateResult CullingTest::iterate (void)
{
	tcu::Surface									resultImage(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	// generate scene
	generateVertices(drawBuffer);
	extractTriangles(triangles, drawBuffer);

	// draw image
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.enable(GL_CULL_FACE);
		gl.cullFace(m_cullMode);
		gl.frontFace(m_faceOrder);

		m_testCtx.getLog() << tcu::TestLog::Message << "Setting front face to " << glu::getWindingName(m_faceOrder) << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting cull face to " << glu::getFaceName(m_cullMode) << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing test pattern (" << glu::getPrimitiveTypeName(m_primitive) << ")" << tcu::TestLog::EndMessage;

		drawPrimitives(resultImage, drawBuffer, m_primitive);
	}

	// compare
	{
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= getPixelFormat().redBits;
		args.greenBits		= getPixelFormat().greenBits;
		args.blueBits		= getPixelFormat().blueBits;

		scene.triangles.swap(triangles);

		if (verifyTriangleGroupRasterization(resultImage, scene, args, m_testCtx.getLog(), tcu::VERIFICATIONMODE_WEAK))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rendering");
	}

	return STOP;
}